

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQInstance::Init(SQInstance *this,SQSharedState *ss)

{
  SQUnsignedInteger SVar1;
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  
  in_RDI[1].super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  in_RDI[1]._next = (SQCollectable_conflict *)0x0;
  SVar1 = in_RDI[1].super_SQRefCounted._uiRef;
  *(long *)(SVar1 + 8) = *(long *)(SVar1 + 8) + 1;
  in_RDI[1].super_SQRefCounted._vptr_SQRefCounted =
       *(_func_int ***)(in_RDI[1].super_SQRefCounted._uiRef + 0x30);
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

void SQInstance::Init(SQSharedState *ss)
{
    _userpointer = NULL;
    _hook = NULL;
    __ObjAddRef(_class);
    _delegate = _class->_members;
    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}